

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.h
# Opt level: O0

void NetworkDataType::deserializedata<std::__cxx11::string,int,int,int,int,int>
               (binarydata *data,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,int *args_1,
               int *args_2,int *args_3,int *args_4,int *args_5)

{
  Options OVar1;
  _Ios_Openmode _Var2;
  PortableBinaryInputArchive archive;
  stringstream stream;
  binarydata *in_stack_fffffffffffffcf8;
  undefined7 in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd14;
  undefined4 uVar3;
  int *in_stack_fffffffffffffd18;
  Options *in_stack_fffffffffffffd20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd28;
  PortableBinaryInputArchive *in_stack_fffffffffffffd30;
  int *in_stack_fffffffffffffd40;
  string local_1d8 [32];
  stringstream local_1b8 [440];
  
  binarydata::operator_cast_to_string(in_stack_fffffffffffffcf8);
  _Var2 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_1b8,local_1d8,_Var2);
  std::__cxx11::string::~string(local_1d8);
  OVar1 = cereal::PortableBinaryInputArchive::Options::Default();
  uVar3 = CONCAT13(OVar1.itsInputEndianness,(int3)in_stack_fffffffffffffd14);
  cereal::PortableBinaryInputArchive::PortableBinaryInputArchive
            (in_stack_fffffffffffffd30,(istream *)in_stack_fffffffffffffd28,
             in_stack_fffffffffffffd20);
  cereal::InputArchive<cereal::PortableBinaryInputArchive,1u>::operator()
            (&in_stack_fffffffffffffd30->super_InputArchive<cereal::PortableBinaryInputArchive,_1U>,
             in_stack_fffffffffffffd28,(int *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
             (int *)CONCAT44(uVar3,_Var2),
             (int *)CONCAT17(OVar1.itsInputEndianness,in_stack_fffffffffffffd08),
             in_stack_fffffffffffffd40);
  cereal::PortableBinaryInputArchive::~PortableBinaryInputArchive
            ((PortableBinaryInputArchive *)0x3543b9);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return;
}

Assistant:

static void deserializedata(const binarydata &data, T & ... args){
        std::stringstream stream(data);
        cereal::PortableBinaryInputArchive archive(stream);
        archive(args...);
    }